

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuf.c
# Opt level: O2

void * ringbuf_trydequeue(ringbuf *rbuf)

{
  int iVar1;
  ulong uVar2;
  void *pvVar3;
  bool bVar4;
  unsigned_long _zzq_args [6];
  unsigned_long _zzq_result;
  
  iVar1 = util_semaphore_trywait(&(rbuf->field_3).nused);
  if ((iVar1 == 0) && (rbuf->running != 0)) {
    LOCK();
    uVar2 = (rbuf->field_0).read_pos;
    (rbuf->field_0).read_pos = (rbuf->field_0).read_pos + 1;
    UNLOCK();
    uVar2 = uVar2 & rbuf->len_mask;
    do {
      do {
        pvVar3 = (void *)rbuf[1].field_0.read_pos_padding[uVar2];
      } while (pvVar3 == (void *)0x0);
      LOCK();
      bVar4 = pvVar3 == (void *)rbuf[1].field_0.read_pos_padding[uVar2];
      if (bVar4) {
        rbuf[1].field_0.read_pos_padding[uVar2] = 0;
      }
      UNLOCK();
    } while (!bVar4);
    util_semaphore_post(&(rbuf->field_2).nfree);
  }
  else {
    pvVar3 = (void *)0x0;
  }
  return pvVar3;
}

Assistant:

void *
ringbuf_trydequeue(struct ringbuf *rbuf)
{
	LOG(4, NULL);

	if (util_semaphore_trywait(&rbuf->nused) != 0)
		return NULL;

	if (!rbuf->running)
		return NULL;

	void *data = ringbuf_dequeue_atomic(rbuf);

	util_semaphore_post(&rbuf->nfree);

	return data;
}